

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * escape_string_internal(char *s,int single_quote)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char local_34;
  char *sss;
  char *ss;
  byte *pbStack_10;
  int single_quote_local;
  char *s_local;
  
  sVar2 = strlen(s);
  pcVar3 = (char *)malloc((sVar2 + 1) * 4);
  sss = pcVar3;
  for (pbStack_10 = (byte *)s; *pbStack_10 != 0; pbStack_10 = pbStack_10 + 1) {
    switch(*pbStack_10) {
    case 7:
      *sss = '\\';
      sss[1] = 'a';
      sss = sss + 2;
      break;
    case 8:
      *sss = '\\';
      sss[1] = 'b';
      sss = sss + 2;
      break;
    case 9:
      *sss = '\\';
      sss[1] = 't';
      sss = sss + 2;
      break;
    case 10:
      *sss = '\\';
      sss[1] = 'n';
      sss = sss + 2;
      break;
    case 0xb:
      *sss = '\\';
      sss[1] = 'v';
      sss = sss + 2;
      break;
    case 0xc:
      *sss = '\\';
      sss[1] = 'f';
      sss = sss + 2;
      break;
    case 0xd:
      *sss = '\\';
      sss[1] = 'r';
      sss = sss + 2;
      break;
    default:
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)(uint)*pbStack_10] & 0x4000) == 0) {
        *sss = '\\';
        sss[1] = 'x';
        if ((uint)((int)(uint)*pbStack_10 >> 4) < 10) {
          local_34 = (char)((int)(uint)*pbStack_10 >> 4) + '0';
        }
        else {
          local_34 = (char)((int)(uint)*pbStack_10 >> 4) + '7';
        }
        pcVar5 = sss + 3;
        sss[2] = local_34;
        if ((*pbStack_10 & 0xf) < 10) {
          cVar1 = (*pbStack_10 & 0xf) + 0x30;
        }
        else {
          cVar1 = (*pbStack_10 & 0xf) + 0x37;
        }
        sss = sss + 4;
        *pcVar5 = cVar1;
      }
      else {
        *sss = *pbStack_10;
        sss = sss + 1;
      }
      break;
    case 0x22:
      if (single_quote == 0) {
        *sss = '\\';
        sss[1] = *pbStack_10;
        sss = sss + 2;
      }
      else {
        *sss = *pbStack_10;
        sss = sss + 1;
      }
      break;
    case 0x27:
      if (single_quote == 0) {
        *sss = *pbStack_10;
        sss = sss + 1;
      }
      else {
        *sss = '\\';
        sss[1] = *pbStack_10;
        sss = sss + 2;
      }
      break;
    case 0x5c:
      *sss = '\\';
      sss[1] = '\\';
      sss = sss + 2;
    }
  }
  *sss = '\0';
  return pcVar3;
}

Assistant:

static char *escape_string_internal(char *s, int single_quote) {
  char *ss = (char *)MALLOC((strlen(s) + 1) * 4), *sss = ss;
  for (; *s; s++) {
    switch (*s) {
      case '\b':
        ESC('b');
      case '\f':
        ESC('f');
      case '\n':
        ESC('n');
      case '\r':
        ESC('r');
      case '\t':
        ESC('t');
      case '\v':
        ESC('v');
      case '\a':
        ESC('a');
      case '\\':
        ESC('\\');
      case '\"':
        if (!single_quote) {
          ESC(*s);
        }
        *ss++ = *s;
        break;
      case '\'':
        if (single_quote) {
          ESC(*s);
        }
        *ss++ = *s;
        break;
      default:
        if (isprint_(*s))
          *ss++ = *s;
        else {
          *ss++ = '\\';
          *ss++ = 'x';
          *ss++ = tohex2((unsigned char)*s);
          *ss++ = tohex1((unsigned char)*s);
        }
        break;
    }
  }
  *ss = 0;
  return sss;
}